

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

int mbedtls_ssl_check_timer(mbedtls_ssl_context *ssl)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (ssl->f_get_timer != (mbedtls_ssl_get_timer_t *)0x0) {
    iVar1 = (*ssl->f_get_timer)(ssl->p_timer);
    if (iVar1 == 2) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x131,"timer expired");
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ssl_check_timer(mbedtls_ssl_context *ssl)
{
    if (ssl->f_get_timer == NULL) {
        return 0;
    }

    if (ssl->f_get_timer(ssl->p_timer) == 2) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("timer expired"));
        return -1;
    }

    return 0;
}